

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

bool __thiscall QUnixPrintWidgetPrivate::checkFields(QUnixPrintWidgetPrivate *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  QFlags<QMessageBox::StandardButton> QVar4;
  int iVar5;
  ulong uVar6;
  QString *in_RDI;
  long in_FS_OFFSET;
  int ret;
  bool opened;
  bool exists;
  QFileInfo fi;
  QFile f;
  QString file;
  OpenModeFlag in_stack_fffffffffffffe8c;
  QFlags<QIODeviceBase::OpenModeFlag> *in_stack_fffffffffffffe90;
  QWidget *pQVar7;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined8 in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  byte local_12b;
  QChar local_12a [4];
  QChar in_stack_fffffffffffffede;
  undefined1 local_110 [24];
  undefined1 local_f8 [24];
  uint local_e0;
  QChar local_da [13];
  undefined1 local_c0 [24];
  undefined1 local_a8 [32];
  uint local_88;
  QChar local_82 [13];
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QWidget::isEnabled((QWidget *)0x16f354);
  if (bVar1) {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QLineEdit::text();
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QFile::QFile((QFile *)&local_30,(QString *)&local_20);
    local_38 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_38,(QFileDevice *)&local_30);
    bVar2 = QFileInfo::exists();
    bVar2 = bVar2 & 1;
    if ((bVar2 == 0) || (uVar6 = QFileInfo::isDir(), (uVar6 & 1) == 0)) {
      if ((bVar2 == 0) || (uVar6 = QFileInfo::isWritable(), (uVar6 & 1) != 0)) {
        QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        bVar3 = QFile::open((QFlags_conflict *)&local_30);
        if ((bVar3 & 1) != 0) {
          if (bVar2 != 0) {
            pQVar7 = (QWidget *)in_RDI[5].d.size;
            QWidget::windowTitle();
            QPrintDialog::tr((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                             (char *)pQVar7,in_stack_fffffffffffffe8c);
            QChar::QChar<char16_t,_true>(local_12a,L' ');
            QString::arg<QString,_true>
                      (in_RDI,in_stack_fffffffffffffea8,iVar5,in_stack_fffffffffffffede);
            QVar4 = operator|((enum_type)((ulong)pQVar7 >> 0x20),(enum_type)pQVar7);
            iVar5 = QMessageBox::question
                              (pQVar7,(QString *)local_f8,(QString *)local_110,
                               (QFlags_conflict *)
                               (ulong)(uint)QVar4.
                                            super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>
                                            .super_QFlagsStorage<QMessageBox::StandardButton>.i,No);
            QString::~QString((QString *)0x16f711);
            QString::~QString((QString *)0x16f71b);
            QString::~QString((QString *)0x16f728);
            if (iVar5 == 0x10000) {
              local_12b = 0;
              bVar1 = true;
              goto LAB_0016f781;
            }
          }
          if (((bVar3 & 1) != 0) && (QFileDevice::close(), bVar2 == 0)) {
            QFile::remove();
          }
          bVar1 = false;
          goto LAB_0016f781;
        }
      }
      pQVar7 = (QWidget *)in_RDI[5].d.size;
      QWidget::windowTitle();
      QPrintDialog::tr((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      QChar::QChar<char16_t,_true>(local_da,L' ');
      QString::arg<QString,_true>
                (in_RDI,in_stack_fffffffffffffea8,(int)((ulong)pQVar7 >> 0x20),
                 in_stack_fffffffffffffede);
      QFlags<QMessageBox::StandardButton>::QFlags
                ((QFlags<QMessageBox::StandardButton> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe8c);
      QMessageBox::warning
                (pQVar7,(QString *)local_a8,(QString *)local_c0,(QFlags_conflict *)(ulong)local_e0,
                 NoButton);
      QString::~QString((QString *)0x16f62b);
      QString::~QString((QString *)0x16f638);
      QString::~QString((QString *)0x16f645);
      local_12b = 0;
      bVar1 = true;
    }
    else {
      pQVar7 = (QWidget *)in_RDI[5].d.size;
      QWidget::windowTitle();
      QPrintDialog::tr((char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      QChar::QChar<char16_t,_true>(local_82,L' ');
      QString::arg<QString,_true>(in_RDI,(QString *)pQVar7,iVar5,in_stack_fffffffffffffede);
      QFlags<QMessageBox::StandardButton>::QFlags
                ((QFlags<QMessageBox::StandardButton> *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe8c);
      QMessageBox::warning
                (pQVar7,(QString *)local_50,(QString *)local_68,(QFlags_conflict *)(ulong)local_88,
                 NoButton);
      QString::~QString((QString *)0x16f4ef);
      QString::~QString((QString *)0x16f4fc);
      QString::~QString((QString *)0x16f509);
      local_12b = 0;
      bVar1 = true;
    }
LAB_0016f781:
    QFileInfo::~QFileInfo((QFileInfo *)&local_38);
    QFile::~QFile((QFile *)&local_30);
    QString::~QString((QString *)0x16f7a8);
    if (bVar1) goto LAB_0016f7bb;
  }
  local_12b = 1;
LAB_0016f7bb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_12b & 1);
}

Assistant:

bool QUnixPrintWidgetPrivate::checkFields()
{
    if (widget.filename->isEnabled()) {
        QString file = widget.filename->text();
        QFile f(file);
        QFileInfo fi(f);
        bool exists = fi.exists();
        bool opened = false;
        if (exists && fi.isDir()) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("%1 is a directory.\nPlease choose a different file name.").arg(file));
            return false;
        } else if ((exists && !fi.isWritable()) || !(opened = f.open(QFile::Append))) {
            QMessageBox::warning(q, q->windowTitle(),
                            QPrintDialog::tr("File %1 is not writable.\nPlease choose a different file name.").arg(file));
            return false;
        } else if (exists) {
            int ret = QMessageBox::question(q, q->windowTitle(),
                                            QPrintDialog::tr("%1 already exists.\nDo you want to overwrite it?").arg(file),
                                            QMessageBox::Yes|QMessageBox::No, QMessageBox::No);
            if (ret == QMessageBox::No)
                return false;
        }
        if (opened) {
            f.close();
            if (!exists)
                f.remove();
        }
    }

#if QT_CONFIG(cups)
    if (propertiesDialog) {
        QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(propertiesDialog->widget.pageSetup->m_ui.pagesPerSheetCombo
                                                                    ->currentData());

        QCUPSSupport::PageSet pageSet = qvariant_cast<QCUPSSupport::PageSet>(optionsPane->options.pageSetCombo->currentData());


        if (pagesPerSheet != QCUPSSupport::OnePagePerSheet
            && pageSet != QCUPSSupport::AllPages) {
            QMessageBox::warning(q, q->windowTitle(),
                                 QPrintDialog::tr("Options 'Pages Per Sheet' and 'Page Set' cannot be used together.\nPlease turn one of those options off."));
            return false;
        }
    }
#endif

    // Every test passed. Accept the dialog.
    return true;
}